

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netgroup.cpp
# Opt level: O1

uint32_t __thiscall NetGroupManager::GetMappedAS(NetGroupManager *this,CNetAddr *address)

{
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  Network NVar4;
  uint32_t uVar5;
  int i;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> addr_bytes;
  vector<bool,_std::allocator<bool>_> ip_bits;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  allocator_type local_51;
  vector<bool,_std::allocator<bool>_> local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  NVar4 = CNetAddr::GetNetClass(address);
  uVar5 = 0;
  if ((0xfffffffd < NVar4 - NET_ONION) &&
     (uVar5 = 0,
     ((long)(this->m_asmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
     (long)(this->m_asmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 !=
     -(ulong)(this->m_asmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset)) {
    local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    std::vector<bool,_std::allocator<bool>_>::vector(&local_50,0x80,(bool *)&local_70,&local_51);
    bVar3 = CNetAddr::HasLinkedIPv4(address);
    if (bVar3) {
      uVar7 = 0;
      lVar8 = 0;
      do {
        uVar6 = (uint)uVar7 & 0x3f;
        bVar1 = IPV4_IN_IPV6_PREFIX._M_elems[lVar8];
        lVar9 = 8;
        uVar10 = uVar7;
        do {
          uVar12 = 1L << ((byte)uVar6 & 0x3f);
          uVar11 = uVar10 >> 6;
          if ((bVar1 >> ((int)lVar9 - 1U & 0x1f) & 1) == 0) {
            uVar12 = ~uVar12 & local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               [uVar11];
          }
          else {
            uVar12 = uVar12 | local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              [uVar11];
          }
          local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar11] = uVar12;
          uVar10 = uVar10 + 1;
          uVar6 = uVar6 + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
        lVar8 = lVar8 + 1;
        uVar7 = uVar7 + 8;
      } while (lVar8 != 0xc);
      uVar5 = CNetAddr::GetLinkedIPv4(address);
      uVar7 = local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[1];
      lVar8 = 0;
      do {
        uVar10 = 0x100000000 << ((byte)lVar8 & 0x3f);
        uVar11 = ~uVar10 & uVar7;
        uVar7 = uVar7 | uVar10;
        if ((uVar5 << ((byte)lVar8 & 0x1f) & 0x80000000) == 0) {
          uVar7 = uVar11;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x20);
      local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[1] = uVar7;
    }
    else {
      if (address->m_net != NET_IPV6) {
        __assert_fail("address.IsIPv6()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netgroup.cpp"
                      ,0x65,"uint32_t NetGroupManager::GetMappedAS(const CNetAddr &) const");
      }
      CNetAddr::GetAddrBytes(&local_70,address);
      uVar7 = 0;
      lVar8 = 0;
      do {
        uVar6 = (uint)uVar7 & 0x3f;
        bVar1 = *(byte *)(CONCAT71(local_70.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_70.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_) + lVar8);
        lVar9 = 8;
        uVar10 = uVar7;
        do {
          uVar12 = 1L << ((byte)uVar6 & 0x3f);
          uVar11 = uVar10 >> 6;
          if ((bVar1 >> ((int)lVar9 - 1U & 0x1f) & 1) == 0) {
            uVar12 = ~uVar12 & local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               [uVar11];
          }
          else {
            uVar12 = uVar12 | local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              [uVar11];
          }
          local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar11] = uVar12;
          uVar10 = uVar10 + 1;
          uVar6 = uVar6 + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
        lVar8 = lVar8 + 1;
        uVar7 = uVar7 + 8;
      } while (lVar8 != 0x10);
      pvVar2 = (void *)CONCAT71(local_70.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_70.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_70.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
    }
    uVar5 = Interpret(&this->m_asmap,&local_50);
    if (local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t NetGroupManager::GetMappedAS(const CNetAddr& address) const
{
    uint32_t net_class = address.GetNetClass();
    if (m_asmap.size() == 0 || (net_class != NET_IPV4 && net_class != NET_IPV6)) {
        return 0; // Indicates not found, safe because AS0 is reserved per RFC7607.
    }
    std::vector<bool> ip_bits(128);
    if (address.HasLinkedIPv4()) {
        // For lookup, treat as if it was just an IPv4 address (IPV4_IN_IPV6_PREFIX + IPv4 bits)
        for (int8_t byte_i = 0; byte_i < 12; ++byte_i) {
            for (uint8_t bit_i = 0; bit_i < 8; ++bit_i) {
                ip_bits[byte_i * 8 + bit_i] = (IPV4_IN_IPV6_PREFIX[byte_i] >> (7 - bit_i)) & 1;
            }
        }
        uint32_t ipv4 = address.GetLinkedIPv4();
        for (int i = 0; i < 32; ++i) {
            ip_bits[96 + i] = (ipv4 >> (31 - i)) & 1;
        }
    } else {
        // Use all 128 bits of the IPv6 address otherwise
        assert(address.IsIPv6());
        auto addr_bytes = address.GetAddrBytes();
        for (int8_t byte_i = 0; byte_i < 16; ++byte_i) {
            uint8_t cur_byte = addr_bytes[byte_i];
            for (uint8_t bit_i = 0; bit_i < 8; ++bit_i) {
                ip_bits[byte_i * 8 + bit_i] = (cur_byte >> (7 - bit_i)) & 1;
            }
        }
    }
    uint32_t mapped_as = Interpret(m_asmap, ip_bits);
    return mapped_as;
}